

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_value_visit<ritobin::I8>
          (BinBinaryReader *this,I8 *value)

{
  byte *pbVar1;
  char **ppcVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  
  pbVar3 = (byte *)(this->reader).cur_;
  pbVar4 = (byte *)(this->reader).cap_;
  pbVar1 = pbVar3 + 1;
  if (pbVar4 < pbVar1) {
    bVar5 = fail_msg(this,"reader.read(value.value)",(this->reader).cur_);
  }
  else {
    bVar5 = *pbVar3;
    value->value = bVar5;
    ppcVar2 = &(this->reader).cur_;
    *ppcVar2 = *ppcVar2 + 1;
  }
  return (bool)(pbVar1 <= pbVar4 | bVar5 & 1);
}

Assistant:

inline bool read(T& value) noexcept {
            static_assert(std::is_arithmetic_v<T>);
            if (cur_ + sizeof(T) > cap_) {
                return false;
            }
            memcpy(&value, cur_, sizeof(T));
            cur_ += sizeof(T);
            return true;
        }